

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

void __thiscall Assimp::B3DImporter::ReadTRIS(B3DImporter *this,int v0)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  aiMesh *this_00;
  pointer paVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  size_type sVar10;
  uint *puVar11;
  aiFace *paVar12;
  ulong uVar13;
  aiFace *local_f0;
  allocator<char> local_99;
  string local_98;
  uint local_78;
  uint local_74;
  int i2;
  int i1;
  int i0;
  int i;
  aiFace *face;
  int n_tris;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> mesh;
  allocator<char> local_39;
  string local_38;
  uint local_18;
  int local_14;
  int matid;
  int v0_local;
  B3DImporter *this_local;
  
  local_14 = v0;
  _matid = this;
  uVar3 = ReadInt(this);
  if (uVar3 == 0xffffffff) {
    local_18 = 0;
  }
  else {
    local_18 = uVar3;
    if (((int)uVar3 < 0) ||
       (sVar10 = std::
                 vector<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>,_std::allocator<std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>_>_>
                 ::size(&this->_materials), (int)sVar10 <= (int)uVar3)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Bad material id",&local_39);
      Fail(this,&local_38);
    }
  }
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  std::unique_ptr<aiMesh,std::default_delete<aiMesh>>::unique_ptr<std::default_delete<aiMesh>,void>
            ((unique_ptr<aiMesh,std::default_delete<aiMesh>> *)&stack0xffffffffffffffa8,this_00);
  uVar3 = local_18;
  paVar6 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->
                     ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)&stack0xffffffffffffffa8);
  paVar6->mMaterialIndex = uVar3;
  paVar6 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->
                     ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)&stack0xffffffffffffffa8);
  paVar6->mNumFaces = 0;
  paVar6 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->
                     ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)&stack0xffffffffffffffa8);
  paVar6->mPrimitiveTypes = 4;
  uVar3 = ChunkSize(this);
  face._4_4_ = uVar3 / 0xc;
  uVar7 = (ulong)(int)face._4_4_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar7;
  uVar8 = SUB168(auVar1 * ZEXT816(0x10),0);
  uVar13 = uVar8 + 8;
  if (0xfffffffffffffff7 < uVar8) {
    uVar13 = 0xffffffffffffffff;
  }
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar13 = 0xffffffffffffffff;
  }
  puVar9 = (ulong *)operator_new__(uVar13);
  *puVar9 = uVar7;
  paVar12 = (aiFace *)(puVar9 + 1);
  if (uVar7 != 0) {
    local_f0 = paVar12;
    do {
      aiFace::aiFace(local_f0);
      local_f0 = local_f0 + 1;
    } while (local_f0 != paVar12 + uVar7);
  }
  paVar6 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->
                     ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)&stack0xffffffffffffffa8);
  paVar6->mFaces = paVar12;
  i1 = 0;
  _i0 = paVar12;
  while( true ) {
    if ((int)face._4_4_ <= i1) {
      std::
      vector<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>,std::allocator<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>>
      ::emplace_back<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>
                ((vector<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>,std::allocator<std::unique_ptr<aiMesh,std::default_delete<aiMesh>>>>
                  *)&this->_meshes,
                 (unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)&stack0xffffffffffffffa8);
      std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr
                ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)&stack0xffffffffffffffa8);
      return;
    }
    iVar4 = ReadInt(this);
    i2 = iVar4 + local_14;
    iVar4 = ReadInt(this);
    local_74 = iVar4 + local_14;
    iVar5 = ReadInt(this);
    iVar4 = i2;
    local_78 = iVar5 + local_14;
    if ((((i2 < 0) ||
         (sVar10 = std::
                   vector<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                   ::size(&this->_vertices), uVar3 = local_74, (int)sVar10 <= iVar4)) ||
        ((int)local_74 < 0)) ||
       (((sVar10 = std::
                   vector<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                   ::size(&this->_vertices), uVar2 = local_78, (int)sVar10 <= (int)uVar3 ||
         ((int)local_78 < 0)) ||
        (sVar10 = std::
                  vector<Assimp::B3DImporter::Vertex,_std::allocator<Assimp::B3DImporter::Vertex>_>
                  ::size(&this->_vertices), (int)sVar10 <= (int)uVar2)))) break;
    _i0->mNumIndices = 3;
    puVar11 = (uint *)operator_new__(0xc);
    _i0->mIndices = puVar11;
    *_i0->mIndices = i2;
    _i0->mIndices[1] = local_74;
    _i0->mIndices[2] = local_78;
    paVar6 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->
                       ((unique_ptr<aiMesh,_std::default_delete<aiMesh>_> *)&stack0xffffffffffffffa8
                       );
    paVar6->mNumFaces = paVar6->mNumFaces + 1;
    _i0 = _i0 + 1;
    i1 = i1 + 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Bad triangle index",&local_99);
  Fail(this,&local_98);
}

Assistant:

void B3DImporter::ReadTRIS(int v0) {
	int matid = ReadInt();
	if (matid == -1) {
		matid = 0;
	} else if (matid < 0 || matid >= (int)_materials.size()) {
#ifdef DEBUG_B3D
		ASSIMP_LOG_ERROR_F("material id=", matid);
#endif
		Fail("Bad material id");
	}

	std::unique_ptr<aiMesh> mesh(new aiMesh);

	mesh->mMaterialIndex = matid;
	mesh->mNumFaces = 0;
	mesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

	int n_tris = ChunkSize() / 12;
	aiFace *face = mesh->mFaces = new aiFace[n_tris];

	for (int i = 0; i < n_tris; ++i) {
		int i0 = ReadInt() + v0;
		int i1 = ReadInt() + v0;
		int i2 = ReadInt() + v0;
		if (i0 < 0 || i0 >= (int)_vertices.size() || i1 < 0 || i1 >= (int)_vertices.size() || i2 < 0 || i2 >= (int)_vertices.size()) {
#ifdef DEBUG_B3D
			ASSIMP_LOG_ERROR_F("Bad triangle index: i0=", i0, ", i1=", i1, ", i2=", i2);
#endif
			Fail("Bad triangle index");
			continue;
		}
		face->mNumIndices = 3;
		face->mIndices = new unsigned[3];
		face->mIndices[0] = i0;
		face->mIndices[1] = i1;
		face->mIndices[2] = i2;
		++mesh->mNumFaces;
		++face;
	}

	_meshes.emplace_back(std::move(mesh));
}